

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<Minisat::Solver::VarOrderLt>::insert(Heap<Minisat::Solver::VarOrderLt> *this,int n)

{
  int local_20;
  int local_1c;
  
  local_20 = -1;
  local_1c = n;
  vec<int>::growTo(&this->indices,n + 1,&local_20);
  (this->indices).data[n] = (this->heap).sz;
  vec<int>::push(&this->heap,&local_1c);
  percolateUp(this,(this->indices).data[local_1c]);
  return;
}

Assistant:

void insert(int n)
    {
        indices.growTo(n + 1, -1);
        assert(!inHeap(n));

        indices[n] = heap.size();
        heap.push(n);
        percolateUp(indices[n]);
    }